

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlregexp.c
# Opt level: O1

xmlAutomataStatePtr
xmlAutomataNewAllTrans(xmlAutomataPtr am,xmlAutomataStatePtr from,xmlAutomataStatePtr to,int lax)

{
  xmlAutomataStatePtr target;
  
  if (from == (xmlAutomataStatePtr)0x0 || am == (xmlAutomataPtr)0x0) {
    return (xmlAutomataStatePtr)0x0;
  }
  target = to;
  if (to == (xmlAutomataStatePtr)0x0) {
    target = xmlRegStatePush(am);
    if (target == (xmlRegStatePtr)0x0) goto LAB_0017f496;
    am->state = target;
  }
  xmlRegStateAddTrans(am,from,(xmlRegAtomPtr)0x0,target,-1,0x123457 - (uint)(lax == 0));
LAB_0017f496:
  if (to == (xmlAutomataStatePtr)0x0) {
    to = am->state;
  }
  return to;
}

Assistant:

xmlAutomataStatePtr
xmlAutomataNewAllTrans(xmlAutomataPtr am, xmlAutomataStatePtr from,
		       xmlAutomataStatePtr to, int lax) {
    if ((am == NULL) || (from == NULL))
	return(NULL);
    xmlFAGenerateAllTransition(am, from, to, lax);
    if (to == NULL)
	return(am->state);
    return(to);
}